

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int set_directory_record
              (uchar *p,size_t n,isoent *isoent,iso9660_conflict *iso9660,dir_rec_type t,
              vdd_type vdd_type)

{
  int *piVar1;
  uint32_t uVar2;
  extr_rec *peVar3;
  int iVar4;
  byte bVar5;
  mode_t mVar6;
  uint uVar7;
  wchar_t wVar8;
  isoent *piVar9;
  time_t tVar10;
  uchar *puVar11;
  la_int64_t lVar12;
  la_int64_t lVar13;
  content_conflict *pcVar14;
  time_t tVar15;
  dev_t dVar16;
  uchar uVar17;
  int iVar18;
  long lVar19;
  isofile *piVar20;
  byte *pbVar21;
  uchar uVar22;
  uint32_t *puVar23;
  int64_t iVar24;
  byte *pbVar25;
  bool bVar26;
  ulong uVar27;
  byte *pbVar28;
  uchar uVar29;
  int iVar30;
  byte bVar31;
  uchar uVar32;
  byte *pbVar33;
  size_t sVar34;
  size_t __n;
  char *__src;
  ctl_extr_rec ctl;
  byte local_b2;
  byte local_b1;
  isofile *local_b0;
  ctl_extr_rec local_a8;
  isoent *local_70;
  isoent *local_68;
  isoent *local_60;
  isoent *local_58;
  undefined8 local_50;
  dir_rec_type local_44;
  iso9660_conflict *local_40;
  uchar *local_38;
  
  if (p != (uchar *)0x0) {
    lVar19 = 0x98;
    if (t < DIR_REC_NORMAL) {
      lVar19 = (ulong)t * 4 + 0x8c;
    }
    if (n < (ulong)(long)*(int *)((long)(isoent->rbnode).rb_nodes + lVar19)) {
      return 0;
    }
  }
  sVar34 = 1;
  if ((t == DIR_REC_NORMAL) && (isoent->identifier != (char *)0x0)) {
    sVar34 = (size_t)isoent->id_len;
  }
  local_70 = isoent;
  local_44 = t;
  if (p == (uchar *)0x0) {
    iVar30 = (int)sVar34 + 0x22;
    if ((sVar34 + 0x21 & 1) == 0) {
      iVar30 = (int)(sVar34 + 0x21);
    }
    if (t == DIR_REC_VD) {
      (isoent->dr_len).vd = iVar30;
      return iVar30;
    }
    local_a8.bp = (uchar *)0x0;
  }
  else {
    piVar9 = isoent;
    if (t == DIR_REC_PARENT) {
      piVar9 = isoent->parent;
    }
    piVar20 = isoent->file->hardlink_target;
    if (piVar20 == (isofile *)0x0) {
      piVar20 = isoent->file;
    }
    uVar29 = '\x02';
    if ((piVar9->field_0xe8 & 2) == 0) {
      uVar29 = (piVar20->cur_content->next != (content_conflict *)0x0) << 7;
    }
    p[1] = '\0';
    if ((piVar9->field_0xe8 & 2) == 0) {
      puVar23 = &piVar20->cur_content->location;
    }
    else {
      puVar23 = &piVar9->dir_location;
    }
    uVar2 = *puVar23;
    p[2] = (uchar)uVar2;
    uVar32 = (uchar)(uVar2 >> 8);
    p[3] = uVar32;
    uVar22 = (uchar)(uVar2 >> 0x10);
    p[4] = uVar22;
    uVar17 = (uchar)(uVar2 >> 0x18);
    p[5] = uVar17;
    p[6] = uVar17;
    p[7] = uVar22;
    p[8] = uVar32;
    p[9] = (uchar)uVar2;
    if ((piVar9->field_0xe8 & 2) == 0) {
      iVar24 = piVar20->cur_content->size;
      uVar17 = (uchar)((ulong)iVar24 >> 8);
      uVar22 = (uchar)((ulong)iVar24 >> 0x10);
      uVar32 = (uchar)((ulong)iVar24 >> 0x18);
    }
    else {
      uVar7 = piVar9->dir_block;
      uVar17 = (char)uVar7 * '\b';
      uVar22 = (uchar)(uVar7 >> 5);
      uVar32 = (uchar)(uVar7 >> 0xd);
      iVar24 = 0;
    }
    p[10] = (uchar)iVar24;
    p[0xb] = uVar17;
    p[0xc] = uVar22;
    p[0xd] = uVar32;
    p[0xe] = uVar32;
    p[0xf] = uVar22;
    p[0x10] = uVar17;
    p[0x11] = (uchar)iVar24;
    tVar10 = archive_entry_mtime(piVar9->file->entry);
    set_time_915(p + 0x12,tVar10);
    t = local_44;
    isoent = local_70;
    p[0x19] = uVar29;
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    iVar30 = iso9660->volume_sequence_number;
    uVar29 = (uchar)iVar30;
    p[0x1c] = uVar29;
    uVar17 = (uchar)((uint)iVar30 >> 8);
    p[0x1d] = uVar17;
    p[0x1e] = uVar17;
    p[0x1f] = uVar29;
    p[0x20] = (uchar)sVar34;
    if (local_44 < DIR_REC_PARENT) {
      p[0x21] = '\0';
    }
    else if (local_44 == DIR_REC_PARENT) {
      p[0x21] = '\x01';
    }
    else if (local_70->identifier == (char *)0x0) {
      p[0x21] = '\0';
    }
    else {
      memcpy(p + 0x21,local_70->identifier,sVar34);
    }
    local_a8.bp = p + -1;
    local_a8.dr_len = (int)(sVar34 + 0x21);
    if ((sVar34 + 0x21 & 1) != 0) {
      p[sVar34 + 0x21] = '\0';
      local_a8.dr_len = (int)sVar34 + 0x22;
    }
    iVar30 = local_a8.dr_len;
    if (t == DIR_REC_VD) goto LAB_00153c04;
  }
  local_a8.dr_len = iVar30;
  if ((vdd_type != VDD_JOLIET) && (((uint)iso9660->opt & 0x1800000) != 0)) {
    puVar11 = local_a8.bp + iVar30;
    if (local_a8.bp == (uchar *)0x0) {
      puVar11 = (uchar *)0x0;
    }
    local_a8.use_extr = 0;
    local_a8.isoent = isoent;
    local_a8.ce_ptr = (uchar *)0x0;
    local_a8.limit = 0xe2;
    local_a8.cur_len = iVar30;
    if (t == DIR_REC_PARENT) {
      local_58 = isoent->rr_parent;
      local_60 = isoent->parent;
      local_68 = local_58;
      if (local_58 == (isoent *)0x0) {
        local_68 = isoent->parent;
      }
      piVar20 = local_68->file;
      local_b2 = (local_58 != (isoent *)0x0) << 5 | 0x81;
      local_50 = 0;
    }
    else {
      piVar20 = isoent->file;
      local_b2 = 0x81;
      if (t == DIR_REC_SELF) {
        local_50 = CONCAT71((int7)((ulong)local_a8.bp >> 8),1);
        if (local_70->parent == local_70) {
          if (puVar11 == (uchar *)0x0) {
            puVar11 = (uchar *)0x0;
          }
          else {
            puVar11[1] = 'S';
            puVar11[2] = 'P';
            puVar11[3] = '\a';
            puVar11[4] = '\x01';
            puVar11[5] = 0xbe;
            puVar11[6] = 0xef;
            puVar11[7] = '\0';
            puVar11 = puVar11 + 7;
          }
          iVar30 = iVar30 + 7;
          local_a8.cur_len = iVar30;
          goto LAB_00152e3f;
        }
        local_58 = (isoent *)0x0;
      }
      else {
        if (t == DIR_REC_NORMAL) {
          mVar6 = archive_entry_filetype(piVar20->entry);
          bVar5 = (local_70->rr_child != (isoent *)0x0) << 4 |
                  (local_70->rr_parent != (isoent *)0x0) << 6 | (mVar6 == 0xa000) << 2;
          local_b2 = bVar5 | 0x89;
          mVar6 = archive_entry_filetype(piVar20->entry);
          if ((mVar6 == 0x2000) || (mVar6 = archive_entry_filetype(piVar20->entry), mVar6 == 0x6000)
             ) {
            local_b2 = bVar5 | 0x8b;
          }
        }
        local_50 = 0;
LAB_00152e3f:
        local_58 = (isoent *)0x0;
      }
      local_58 = (isoent *)0x0;
      local_60 = local_70;
      local_68 = local_70;
    }
    if (0xdd < iVar30) {
      puVar11 = extra_next_record(&local_a8,5);
    }
    if (puVar11 == (uchar *)0x0) {
      puVar11 = (uchar *)0x0;
    }
    else {
      puVar11[1] = 'R';
      puVar11[2] = 'R';
      puVar11[3] = '\x05';
      puVar11[4] = '\x01';
      puVar11[5] = local_b2;
      puVar11 = puVar11 + 5;
    }
    if ((local_a8.use_extr != 0) &&
       (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
      piVar1 = &peVar3->offset;
      *piVar1 = *piVar1 + 5;
    }
    local_a8.cur_len = local_a8.cur_len + 5;
    local_b0 = piVar20;
    local_38 = p;
    if ((local_b2 & 8) != 0) {
      __src = (piVar20->basename).s;
      __n = (piVar20->basename).length;
      if (local_a8.limit - local_a8.cur_len < 6) {
        puVar11 = extra_next_record(&local_a8,6);
      }
      if (puVar11 != (uchar *)0x0) {
        puVar11[1] = 'N';
        puVar11[2] = 'M';
        puVar11[4] = '\x01';
      }
      uVar27 = (ulong)(uint)(local_a8.limit - local_a8.cur_len);
      if (0xfe < (uint)(local_a8.limit - local_a8.cur_len)) {
        uVar27 = 0xff;
      }
      for (; uVar27 < __n + 5; __n = __n - sVar34) {
        if (puVar11 == (uchar *)0x0) {
          sVar34 = (long)((uVar27 << 0x20) + -0x500000000) >> 0x20;
          puVar11 = (uchar *)0x0;
        }
        else {
          puVar11[3] = (uchar)uVar27;
          puVar11[5] = '\x01';
          sVar34 = (long)((uVar27 << 0x20) + -0x500000000) >> 0x20;
          memcpy(puVar11 + 6,__src,sVar34);
          puVar11 = puVar11 + uVar27;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0))
        {
          piVar1 = &peVar3->offset;
          *piVar1 = *piVar1 + (int)uVar27;
        }
        local_a8.cur_len = local_a8.cur_len + (int)uVar27;
        if (local_a8.limit - local_a8.cur_len < 6) {
          puVar11 = extra_next_record(&local_a8,6);
          uVar27 = (ulong)(uint)(local_a8.limit - local_a8.cur_len);
          if (0xfe < (uint)(local_a8.limit - local_a8.cur_len)) {
            uVar27 = 0xff;
          }
        }
        if (puVar11 != (uchar *)0x0) {
          puVar11[1] = 'N';
          puVar11[2] = 'M';
          puVar11[4] = '\x01';
        }
        __src = __src + sVar34;
      }
      iVar30 = (int)__n + 5;
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11[3] = (uchar)iVar30;
        puVar11[5] = '\0';
        memcpy(puVar11 + 6,__src,__n);
        puVar11 = puVar11 + iVar30;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + iVar30;
      }
      local_a8.cur_len = iVar30 + local_a8.cur_len;
    }
    piVar20 = local_b0;
    if ((local_b2 & 1) != 0) {
      if (local_a8.limit - local_a8.cur_len < 0x2c) {
        puVar11 = extra_next_record(&local_a8,0x2c);
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        mVar6 = archive_entry_mode(piVar20->entry);
        lVar12 = archive_entry_uid(piVar20->entry);
        lVar13 = archive_entry_gid(piVar20->entry);
        piVar20 = local_b0;
        if (((uint)iso9660->opt & 0x1800000) == 0x1000000) {
          uVar7 = 0x16d;
          if ((mVar6 & 0x49) == 0) {
            uVar7 = 0x124;
          }
          mVar6 = mVar6 & 0xfffff049 | uVar7;
        }
        puVar11[1] = 'P';
        puVar11[2] = 'X';
        puVar11[3] = ',';
        puVar11[4] = '\x01';
        puVar11[5] = (uchar)mVar6;
        uVar29 = (uchar)(mVar6 >> 8);
        puVar11[6] = uVar29;
        uVar17 = (uchar)(mVar6 >> 0x10);
        puVar11[7] = uVar17;
        uVar22 = (uchar)(mVar6 >> 0x18);
        puVar11[8] = uVar22;
        puVar11[9] = uVar22;
        puVar11[10] = uVar17;
        puVar11[0xb] = uVar29;
        puVar11[0xc] = (uchar)mVar6;
        uVar7 = archive_entry_nlink(local_b0->entry);
        puVar11[0xd] = (uchar)uVar7;
        uVar29 = (uchar)(uVar7 >> 8);
        puVar11[0xe] = uVar29;
        uVar17 = (uchar)(uVar7 >> 0x10);
        puVar11[0xf] = uVar17;
        uVar22 = (uchar)(uVar7 >> 0x18);
        puVar11[0x10] = uVar22;
        puVar11[0x11] = uVar22;
        puVar11[0x12] = uVar17;
        puVar11[0x13] = uVar29;
        puVar11[0x14] = (uchar)uVar7;
        puVar11[0x15] = (uchar)lVar12;
        uVar29 = (uchar)((ulong)lVar12 >> 8);
        puVar11[0x16] = uVar29;
        uVar17 = (uchar)((ulong)lVar12 >> 0x10);
        puVar11[0x17] = uVar17;
        uVar22 = (uchar)((ulong)lVar12 >> 0x18);
        puVar11[0x18] = uVar22;
        puVar11[0x19] = uVar22;
        puVar11[0x1a] = uVar17;
        puVar11[0x1b] = uVar29;
        puVar11[0x1c] = (uchar)lVar12;
        puVar11[0x1d] = (uchar)lVar13;
        uVar29 = (uchar)((ulong)lVar13 >> 8);
        puVar11[0x1e] = uVar29;
        uVar17 = (uchar)((ulong)lVar13 >> 0x10);
        puVar11[0x1f] = uVar17;
        uVar22 = (uchar)((ulong)lVar13 >> 0x18);
        puVar11[0x20] = uVar22;
        puVar11[0x21] = uVar22;
        puVar11[0x22] = uVar17;
        puVar11[0x23] = uVar29;
        puVar11[0x24] = (uchar)lVar13;
        if ((local_60->field_0xe8 & 2) == 0) {
          if (piVar20->hardlink_target == (isofile *)0x0) {
            pcVar14 = piVar20->cur_content;
          }
          else {
            pcVar14 = piVar20->hardlink_target->cur_content;
          }
          uVar2 = pcVar14->location;
          puVar11[0x25] = (uchar)uVar2;
          uVar29 = (uchar)(uVar2 >> 8);
          puVar11[0x26] = uVar29;
          uVar17 = (uchar)(uVar2 >> 0x10);
          puVar11[0x27] = uVar17;
          uVar22 = (uchar)(uVar2 >> 0x18);
          puVar11[0x28] = uVar22;
          puVar11[0x29] = uVar22;
          puVar11[0x2a] = uVar17;
          puVar11[0x2b] = uVar29;
          puVar11[0x2c] = (uchar)uVar2;
        }
        else {
          uVar2 = local_60->dir_location;
          puVar11[0x25] = (uchar)uVar2;
          uVar29 = (uchar)(uVar2 >> 8);
          puVar11[0x26] = uVar29;
          uVar17 = (uchar)(uVar2 >> 0x10);
          puVar11[0x27] = uVar17;
          uVar22 = (uchar)(uVar2 >> 0x18);
          puVar11[0x28] = uVar22;
          puVar11[0x29] = uVar22;
          puVar11[0x2a] = uVar17;
          puVar11[0x2b] = uVar29;
          puVar11[0x2c] = (uchar)uVar2;
        }
        puVar11 = puVar11 + 0x2c;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 0x2c;
      }
      local_a8.cur_len = local_a8.cur_len + 0x2c;
    }
    if ((local_b2 & 4) != 0) {
      if (local_a8.limit - local_a8.cur_len < 7) {
        puVar11 = extra_next_record(&local_a8,7);
      }
      pbVar28 = (byte *)(piVar20->symlink).s;
      if (puVar11 != (uchar *)0x0) {
        puVar11[1] = 'S';
        puVar11[2] = 'L';
        puVar11[4] = '\x01';
      }
      bVar5 = 0;
LAB_0015335b:
      iVar18 = local_a8.limit - local_a8.cur_len;
      iVar30 = 0xff;
      if (iVar18 < 0xff) {
        iVar30 = iVar18;
      }
      local_b1 = 0;
      bVar31 = *pbVar28;
      if (iVar18 < 0xc || bVar31 == 0) {
        iVar18 = 5;
        pbVar21 = (byte *)0x0;
      }
      else {
        pbVar25 = puVar11 + 6;
        if (puVar11 == (uchar *)0x0) {
          pbVar25 = (byte *)0x0;
        }
        iVar18 = 0;
        pbVar33 = (byte *)0x0;
        pbVar21 = (byte *)0x0;
        do {
          if ((bVar31 == 0x2f) && (bVar5 == 0)) {
            if (pbVar25 == (byte *)0x0) {
              pbVar25 = (byte *)0x0;
            }
            else {
              pbVar25[0] = 8;
              pbVar25[1] = 0;
              pbVar21 = pbVar25;
              pbVar25 = pbVar25 + 2;
            }
            pbVar28 = pbVar28 + 1;
            bVar5 = 0x2f;
LAB_0015352c:
            iVar18 = iVar18 + 2;
            pbVar33 = (byte *)0x0;
          }
          else {
            if (((bVar5 != 0x2f) && (bVar5 != 0)) || (bVar31 != 0x2e)) {
              if ((bVar31 != 0x2f) ||
                 (((pbVar28[1] != 0x2e || (pbVar28[2] != 0x2e)) ||
                  ((pbVar28[3] != 0x2f && (pbVar28[3] != 0)))))) goto LAB_00153430;
LAB_00153413:
              if (pbVar25 == (byte *)0x0) {
                pbVar25 = (byte *)0x0;
              }
              else {
                pbVar25[0] = 4;
                pbVar25[1] = 0;
                bVar31 = *pbVar28;
                pbVar21 = pbVar25;
                pbVar25 = pbVar25 + 2;
              }
              lVar19 = (ulong)(bVar31 == 0x2f) + 2;
LAB_00153526:
              pbVar28 = pbVar28 + lVar19;
              bVar5 = 0x2e;
              goto LAB_0015352c;
            }
            if ((pbVar28[1] == 0x2e) && ((pbVar28[2] == 0 || (pbVar28[2] == 0x2f))))
            goto LAB_00153413;
LAB_00153430:
            if (((bVar5 == 0x2f) || (bVar5 == 0)) && (bVar31 == 0x2e)) {
              if ((pbVar28[1] == 0) || (pbVar28[1] == 0x2f)) {
LAB_0015346c:
                if (pbVar25 == (byte *)0x0) {
                  pbVar33 = (byte *)0x0;
                }
                else {
                  pbVar25[0] = 2;
                  pbVar25[1] = 0;
                  pbVar33 = pbVar25 + 2;
                  bVar31 = *pbVar28;
                  pbVar21 = pbVar25;
                }
                lVar19 = (ulong)(bVar31 == 0x2f) + 1;
                pbVar25 = pbVar33;
                goto LAB_00153526;
              }
LAB_00153499:
              if ((bVar31 == 0x2f) || (pbVar33 == (byte *)0x0)) goto LAB_001534a9;
LAB_001534e3:
              if (pbVar25 == (byte *)0x0) {
                pbVar25 = (byte *)0x0;
              }
              else {
                *pbVar25 = bVar31;
                pbVar25 = pbVar25 + 1;
                *pbVar33 = *pbVar33 + 1;
              }
              pbVar28 = pbVar28 + 1;
              iVar18 = iVar18 + 1;
              bVar5 = bVar31;
            }
            else {
              if (bVar31 != 0x2f) goto LAB_00153499;
              if ((pbVar28[1] == 0x2e) && ((pbVar28[2] == 0x2f || (pbVar28[2] == 0))))
              goto LAB_0015346c;
LAB_001534a9:
              if (pbVar25 == (byte *)0x0) {
                pbVar25 = (byte *)0x0;
                pbVar33 = &local_b1;
              }
              else {
                pbVar25[0] = 0;
                pbVar25[1] = 0;
                bVar31 = *pbVar28;
                pbVar21 = pbVar25;
                pbVar33 = pbVar25 + 1;
                pbVar25 = pbVar25 + 2;
              }
              iVar18 = iVar18 + 2;
              if (bVar31 != 0x2f) goto LAB_001534e3;
              pbVar28 = pbVar28 + 1;
              bVar5 = 0x2f;
            }
          }
          bVar31 = *pbVar28;
        } while ((bVar31 != 0) && (iVar18 + 0xb < iVar30));
        iVar18 = iVar18 + 5;
      }
      if (bVar31 != 0) {
        if (puVar11 == (uchar *)0x0) {
          puVar11 = (uchar *)0x0;
        }
        else {
          *pbVar21 = *pbVar21 | 1;
          puVar11[3] = (uchar)iVar18;
          puVar11[5] = '\x01';
          puVar11 = puVar11 + iVar18;
        }
        if ((local_a8.use_extr != 0) &&
           (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0))
        {
          piVar1 = &peVar3->offset;
          *piVar1 = *piVar1 + iVar18;
        }
        local_a8.cur_len = iVar18 + local_a8.cur_len;
        if (local_a8.limit - local_a8.cur_len < 0xb) {
          puVar11 = extra_next_record(&local_a8,0xb);
        }
        if (puVar11 != (uchar *)0x0) {
          puVar11[1] = 'S';
          puVar11[2] = 'L';
          puVar11[4] = '\x01';
        }
        goto LAB_0015335b;
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11[3] = (uchar)iVar18;
        puVar11[5] = '\0';
        puVar11 = puVar11 + iVar18;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + iVar18;
      }
      local_a8.cur_len = iVar18 + local_a8.cur_len;
      piVar20 = local_b0;
    }
    iVar30 = local_a8.cur_len;
    wVar8 = archive_entry_birthtime_is_set(piVar20->entry);
    local_40 = iso9660;
    if (wVar8 == L'\0') {
      bVar26 = false;
      iVar18 = 5;
    }
    else {
      tVar10 = archive_entry_birthtime(piVar20->entry);
      tVar15 = archive_entry_mtime(piVar20->entry);
      bVar26 = tVar10 <= tVar15;
      iVar18 = 5;
      if (tVar10 <= tVar15) {
        iVar18 = 0xc;
      }
    }
    wVar8 = archive_entry_mtime_is_set(piVar20->entry);
    iVar4 = iVar18 + 7;
    bVar5 = bVar26 + 2;
    if (wVar8 == L'\0') {
      iVar4 = iVar18;
      bVar5 = bVar26;
    }
    wVar8 = archive_entry_atime_is_set(piVar20->entry);
    bVar31 = bVar5 + 4;
    iVar18 = iVar4 + 7;
    if (wVar8 == L'\0') {
      bVar31 = bVar5;
      iVar18 = iVar4;
    }
    wVar8 = archive_entry_ctime_is_set(local_b0->entry);
    bVar5 = bVar31 | 8;
    iVar4 = iVar18 + 7;
    if (wVar8 == L'\0') {
      bVar5 = bVar31;
      iVar4 = iVar18;
    }
    if (local_a8.limit - iVar30 < iVar4) {
      puVar11 = extra_next_record(&local_a8,iVar4);
    }
    t = local_44;
    isoent = local_70;
    if (puVar11 == (uchar *)0x0) {
      puVar11 = (uchar *)0x0;
    }
    else {
      puVar11[1] = 'T';
      puVar11[2] = 'F';
      puVar11[3] = (uchar)iVar4;
      puVar11[4] = '\x01';
      puVar11[5] = bVar5;
      if ((bVar5 & 1) == 0) {
        puVar11 = puVar11 + 5;
      }
      else {
        tVar10 = archive_entry_birthtime(local_b0->entry);
        set_time_915(puVar11 + 6,tVar10);
        puVar11 = puVar11 + 0xc;
      }
      if ((bVar5 & 2) != 0) {
        tVar10 = archive_entry_mtime(local_b0->entry);
        set_time_915(puVar11 + 1,tVar10);
        puVar11 = puVar11 + 7;
      }
      if ((bVar5 & 4) != 0) {
        tVar10 = archive_entry_atime(local_b0->entry);
        set_time_915(puVar11 + 1,tVar10);
        puVar11 = puVar11 + 7;
      }
      if ((bVar5 & 8) != 0) {
        tVar10 = archive_entry_ctime(local_b0->entry);
        set_time_915(puVar11 + 1,tVar10);
        puVar11 = puVar11 + 7;
      }
    }
    if ((local_a8.use_extr != 0) &&
       (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
      piVar1 = &peVar3->offset;
      *piVar1 = *piVar1 + iVar4;
    }
    local_a8.cur_len = iVar4 + local_a8.cur_len;
    if ((local_b2 & 0x40) != 0) {
      if (local_a8.limit - local_a8.cur_len < 4) {
        puVar11 = extra_next_record(&local_a8,4);
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        builtin_memcpy(puVar11 + 1,"RE\x04\x01",4);
        puVar11 = puVar11 + 4;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 4;
      }
      local_a8.cur_len = local_a8.cur_len + 4;
    }
    if ((local_b2 & 0x20) != 0) {
      if (local_a8.limit - local_a8.cur_len < 0xc) {
        puVar11 = extra_next_record(&local_a8,0xc);
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11[1] = 'P';
        puVar11[2] = 'L';
        puVar11[3] = '\f';
        puVar11[4] = '\x01';
        uVar2 = local_58->dir_location;
        puVar11[5] = (uchar)uVar2;
        uVar29 = (uchar)(uVar2 >> 8);
        puVar11[6] = uVar29;
        uVar17 = (uchar)(uVar2 >> 0x10);
        puVar11[7] = uVar17;
        uVar22 = (uchar)(uVar2 >> 0x18);
        puVar11[8] = uVar22;
        puVar11[9] = uVar22;
        puVar11[10] = uVar17;
        puVar11[0xb] = uVar29;
        puVar11[0xc] = (uchar)uVar2;
        puVar11 = puVar11 + 0xc;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 0xc;
      }
      local_a8.cur_len = local_a8.cur_len + 0xc;
    }
    if ((local_b2 & 0x10) != 0) {
      if (local_a8.limit - local_a8.cur_len < 0xc) {
        puVar11 = extra_next_record(&local_a8,0xc);
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11[1] = 'C';
        puVar11[2] = 'L';
        puVar11[3] = '\f';
        puVar11[4] = '\x01';
        uVar2 = local_68->rr_child->dir_location;
        puVar11[5] = (uchar)uVar2;
        uVar29 = (uchar)(uVar2 >> 8);
        puVar11[6] = uVar29;
        uVar17 = (uchar)(uVar2 >> 0x10);
        puVar11[7] = uVar17;
        uVar22 = (uchar)(uVar2 >> 0x18);
        puVar11[8] = uVar22;
        puVar11[9] = uVar22;
        puVar11[10] = uVar17;
        puVar11[0xb] = uVar29;
        puVar11[0xc] = (uchar)uVar2;
        puVar11 = puVar11 + 0xc;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 0xc;
      }
      local_a8.cur_len = local_a8.cur_len + 0xc;
    }
    if ((local_b2 & 2) != 0) {
      if (local_a8.limit - local_a8.cur_len < 0x14) {
        puVar11 = extra_next_record(&local_a8,0x14);
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11[1] = 'P';
        puVar11[2] = 'N';
        puVar11[3] = '\x14';
        puVar11[4] = '\x01';
        dVar16 = archive_entry_rdev(local_b0->entry);
        uVar29 = (uchar)(dVar16 >> 0x20);
        puVar11[5] = uVar29;
        uVar17 = (uchar)(dVar16 >> 0x28);
        puVar11[6] = uVar17;
        uVar22 = (uchar)(dVar16 >> 0x30);
        puVar11[7] = uVar22;
        uVar32 = (uchar)(dVar16 >> 0x38);
        puVar11[8] = uVar32;
        puVar11[9] = uVar32;
        puVar11[10] = uVar22;
        puVar11[0xb] = uVar17;
        puVar11[0xc] = uVar29;
        puVar11[0xd] = (uchar)dVar16;
        uVar29 = (uchar)(dVar16 >> 8);
        puVar11[0xe] = uVar29;
        uVar17 = (uchar)(dVar16 >> 0x10);
        puVar11[0xf] = uVar17;
        uVar22 = (uchar)(dVar16 >> 0x18);
        puVar11[0x10] = uVar22;
        puVar11[0x11] = uVar22;
        puVar11[0x12] = uVar17;
        puVar11[0x13] = uVar29;
        puVar11[0x14] = (uchar)dVar16;
        puVar11 = puVar11 + 0x14;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 0x14;
      }
      local_a8.cur_len = local_a8.cur_len + 0x14;
    }
    if ((local_b0->zisofs).header_size != '\0') {
      if (local_a8.limit - local_a8.cur_len < 0x10) {
        puVar11 = extra_next_record(&local_a8,0x10);
      }
      if (puVar11 == (uchar *)0x0) {
        puVar11 = (uchar *)0x0;
      }
      else {
        puVar11[1] = 'Z';
        puVar11[2] = 'F';
        puVar11[3] = '\x10';
        puVar11[4] = '\x01';
        puVar11[5] = 'p';
        puVar11[6] = 'z';
        puVar11[7] = (local_b0->zisofs).header_size;
        puVar11[8] = (local_b0->zisofs).log2_bs;
        uVar2 = (local_b0->zisofs).uncompressed_size;
        puVar11[9] = (uchar)uVar2;
        uVar29 = (uchar)(uVar2 >> 8);
        puVar11[10] = uVar29;
        uVar17 = (uchar)(uVar2 >> 0x10);
        puVar11[0xb] = uVar17;
        uVar22 = (uchar)(uVar2 >> 0x18);
        puVar11[0xc] = uVar22;
        puVar11[0xd] = uVar22;
        puVar11[0xe] = uVar17;
        puVar11[0xf] = uVar29;
        puVar11[0x10] = (uchar)uVar2;
        puVar11 = puVar11 + 0x10;
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 0x10;
      }
      local_a8.cur_len = local_a8.cur_len + 0x10;
    }
    if (((char)local_50 != '\0') && (local_68 == local_68->parent)) {
      if (puVar11 != (uchar *)0x0) {
        set_SUSP_CE(puVar11 + 1,local_40->location_rrip_er,0,0xed);
      }
      if ((local_a8.use_extr != 0) &&
         (peVar3 = ((local_a8.isoent)->parent->extr_rec_list).current, peVar3 != (extr_rec *)0x0)) {
        piVar1 = &peVar3->offset;
        *piVar1 = *piVar1 + 0x1c;
      }
      local_a8.cur_len = local_a8.cur_len + 0x1c;
    }
    extra_close_record(&local_a8,0);
    p = local_38;
  }
  if (p == (uchar *)0x0) {
    if (t == DIR_REC_NORMAL) {
      (isoent->dr_len).normal = local_a8.dr_len;
      return local_a8.dr_len;
    }
    if (t == DIR_REC_PARENT) {
      (isoent->dr_len).parent = local_a8.dr_len;
      return local_a8.dr_len;
    }
    (isoent->dr_len).self = local_a8.dr_len;
    return local_a8.dr_len;
  }
LAB_00153c04:
  *p = (uchar)local_a8.dr_len;
  return local_a8.dr_len;
}

Assistant:

static int
set_directory_record(unsigned char *p, size_t n, struct isoent *isoent,
    struct iso9660 *iso9660, enum dir_rec_type t,
    enum vdd_type vdd_type)
{
	unsigned char *bp;
	size_t dr_len;
	size_t fi_len;

	if (p != NULL) {
		/*
		 * Check whether a write buffer size is less than the
		 * saved size which is needed to write this Directory
		 * Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			dr_len = isoent->dr_len.vd; break;
		case DIR_REC_SELF:
			dr_len = isoent->dr_len.self; break;
		case DIR_REC_PARENT:
			dr_len = isoent->dr_len.parent; break;
		case DIR_REC_NORMAL:
		default:
			dr_len = isoent->dr_len.normal; break;
		}
		if (dr_len > n)
			return (0);/* Needs more buffer size. */
	}

	if (t == DIR_REC_NORMAL && isoent->identifier != NULL)
		fi_len = isoent->id_len;
	else
		fi_len = 1;

	if (p != NULL) {
		struct isoent *xisoent;
		struct isofile *file;
		unsigned char flag;

		if (t == DIR_REC_PARENT)
			xisoent = isoent->parent;
		else
			xisoent = isoent;
		file = isoent->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		/* Make a file flag. */
		if (xisoent->dir)
			flag = FILE_FLAG_DIRECTORY;
		else {
			if (file->cur_content->next != NULL)
				flag = FILE_FLAG_MULTI_EXTENT;
			else
				flag = 0;
		}

		bp = p -1;
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (xisoent->dir)
			set_num_733(bp+3, xisoent->dir_location);
		else
			set_num_733(bp+3, file->cur_content->location);
		/* Data Length */
		if (xisoent->dir)
			set_num_733(bp+11,
			    xisoent->dir_block * LOGICAL_BLOCK_SIZE);
		else
			set_num_733(bp+11, (uint32_t)file->cur_content->size);
		/* Recording Date and Time */
		/* NOTE:
		 *  If a file type is symbolic link, you are seeing this
		 *  field value is different from a value mkisofs makes.
		 *  libarchive uses lstat to get this one, but it
		 *  seems mkisofs uses stat to get.
		 */
		set_time_915(bp+19,
		    archive_entry_mtime(xisoent->file->entry));
		/* File Flags */
		bp[26] = flag;
		/* File Unit Size */
		set_num_711(bp+27, 0);
		/* Interleave Gap Size */
		set_num_711(bp+28, 0);
		/* Volume Sequence Number */
		set_num_723(bp+29, iso9660->volume_sequence_number);
		/* Length of File Identifier */
		set_num_711(bp+33, (unsigned char)fi_len);
		/* File Identifier */
		switch (t) {
		case DIR_REC_VD:
		case DIR_REC_SELF:
			set_num_711(bp+34, 0);
			break;
		case DIR_REC_PARENT:
			set_num_711(bp+34, 1);
			break;
		case DIR_REC_NORMAL:
			if (isoent->identifier != NULL)
				memcpy(bp+34, isoent->identifier, fi_len);
			else
				set_num_711(bp+34, 0);
			break;
		}
	} else
		bp = NULL;
	dr_len = 33 + fi_len;
	/* Padding Field */
	if (dr_len & 0x01) {
		dr_len ++;
		if (p != NULL)
			bp[dr_len] = 0;
	}

	/* Volume Descriptor does not record extension. */
	if (t == DIR_REC_VD) {
		if (p != NULL)
			/* Length of Directory Record */
			set_num_711(p, (unsigned char)dr_len);
		else
			isoent->dr_len.vd = (int)dr_len;
		return ((int)dr_len);
	}

	/* Rockridge */
	if (iso9660->opt.rr && vdd_type != VDD_JOLIET)
		dr_len = set_directory_record_rr(bp, (int)dr_len,
		    isoent, iso9660, t);

	if (p != NULL)
		/* Length of Directory Record */
		set_num_711(p, (unsigned char)dr_len);
	else {
		/*
		 * Save the size which is needed to write this
		 * Directory Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			/* This case does not come, but compiler
			 * complains that DIR_REC_VD not handled
			 *  in switch ....  */
			break;
		case DIR_REC_SELF:
			isoent->dr_len.self = (int)dr_len; break;
		case DIR_REC_PARENT:
			isoent->dr_len.parent = (int)dr_len; break;
		case DIR_REC_NORMAL:
			isoent->dr_len.normal = (int)dr_len; break;
		}
	}

	return ((int)dr_len);
}